

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterFuncPtr,_ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLin>::
operator()(ShadedRenderer<ImPlot::GetterFuncPtr,_ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLin>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  int iVar2;
  uint uVar3;
  TransformerLogLin *pTVar4;
  ImPlotPlot *pIVar5;
  ImDrawVert *pIVar6;
  uint *puVar7;
  ImPlotPoint IVar26;
  double dVar8;
  double dVar9;
  ImPlotContext *pIVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  pTVar4 = this->Transformer;
  IVar26.x = (*this->Getter1->Getter)(this->Getter1->Data,prim + 1);
  pIVar10 = GImPlot;
  dVar8 = log10((double)IVar26.x / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar5 = pIVar10->CurrentPlot;
  dVar9 = (pIVar5->XAxis).Range.Min;
  iVar2 = pTVar4->YAxis;
  pTVar4 = this->Transformer;
  IVar1 = pIVar10->PixelRange[iVar2].Min;
  fVar12 = (float)(pIVar10->Mx *
                   (((double)(float)(dVar8 / pIVar10->LogDenX) * ((pIVar5->XAxis).Range.Max - dVar9)
                    + dVar9) - dVar9) + (double)IVar1.x);
  fVar14 = (float)(pIVar10->My[iVar2] * (extraout_XMM1_Qa - pIVar5->YAxis[iVar2].Range.Min) +
                  (double)IVar1.y);
  IVar26.x = (*this->Getter2->Getter)(this->Getter2->Data,prim + 1);
  pIVar10 = GImPlot;
  dVar8 = log10((double)IVar26.x / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar5 = pIVar10->CurrentPlot;
  dVar9 = (pIVar5->XAxis).Range.Min;
  iVar2 = pTVar4->YAxis;
  IVar1 = pIVar10->PixelRange[iVar2].Min;
  fVar13 = (float)(pIVar10->Mx *
                   (((double)(float)(dVar8 / pIVar10->LogDenX) * ((pIVar5->XAxis).Range.Max - dVar9)
                    + dVar9) - dVar9) + (double)IVar1.x);
  fVar15 = (float)(pIVar10->My[iVar2] * (extraout_XMM1_Qa_00 - pIVar5->YAxis[iVar2].Range.Min) +
                  (double)IVar1.y);
  fVar19 = (this->P12).x;
  fVar20 = (this->P12).y;
  fVar22 = (this->P11).x;
  fVar23 = (this->P11).y;
  fVar16 = fVar14 * fVar22 - fVar12 * fVar23;
  fVar24 = fVar19 * fVar15 - fVar20 * fVar13;
  fVar22 = fVar22 - fVar12;
  fVar19 = fVar19 - fVar13;
  fVar21 = fVar20 - fVar15;
  fVar25 = fVar21 * fVar22 - (fVar23 - fVar14) * fVar19;
  auVar17._0_4_ = fVar16 * fVar19 - fVar24 * fVar22;
  auVar17._4_4_ = fVar16 * fVar21 - fVar24 * (fVar23 - fVar14);
  auVar17._8_4_ = fVar14 * 0.0 - fVar20 * 0.0;
  auVar17._12_4_ = fVar14 * 0.0 - fVar20 * 0.0;
  auVar18._4_4_ = fVar25;
  auVar18._0_4_ = fVar25;
  auVar18._8_4_ = fVar21;
  auVar18._12_4_ = fVar21;
  auVar18 = divps(auVar17,auVar18);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar6 = DrawList->_VtxWritePtr;
  pIVar6->col = this->Col;
  pIVar6[1].pos.x = fVar12;
  pIVar6[1].pos.y = fVar14;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar6 = DrawList->_VtxWritePtr;
  pIVar6[1].col = this->Col;
  pIVar6[2].pos = auVar18._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar6 = DrawList->_VtxWritePtr;
  pIVar6[2].col = this->Col;
  pIVar6[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar6 = DrawList->_VtxWritePtr;
  pIVar6[3].col = this->Col;
  IVar1.y = fVar15;
  IVar1.x = fVar13;
  pIVar6[4].pos = IVar1;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar6 = DrawList->_VtxWritePtr;
  pIVar6[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar6 + 5;
  uVar3 = DrawList->_VtxCurrentIdx;
  puVar7 = DrawList->_IdxWritePtr;
  *puVar7 = uVar3;
  uVar11 = -(uint)(fVar20 < fVar23 && fVar14 < fVar15 || fVar15 < fVar14 && fVar23 < fVar20) & 1;
  puVar7[1] = uVar3 + uVar11 + 1;
  puVar7[2] = DrawList->_VtxCurrentIdx + 3;
  puVar7[3] = DrawList->_VtxCurrentIdx + 1;
  puVar7[4] = (uVar11 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar7[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar7 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar12;
  (this->P11).y = fVar14;
  (this->P12).x = fVar13;
  (this->P12).y = fVar15;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }